

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# yolodetectionoutput.cpp
# Opt level: O3

void __thiscall ncnn::YoloDetectionOutput::~YoloDetectionOutput(YoloDetectionOutput *this)

{
  int *piVar1;
  void *pvVar2;
  Allocator *pAVar3;
  
  (this->super_Layer)._vptr_Layer = (_func_int **)&PTR__YoloDetectionOutput_00145ad0;
  if (this->softmax != (Layer *)0x0) {
    (*this->softmax->_vptr_Layer[1])();
  }
  piVar1 = (this->biases).refcount;
  if (piVar1 != (int *)0x0) {
    LOCK();
    *piVar1 = *piVar1 + -1;
    UNLOCK();
    if (*piVar1 == 0) {
      pvVar2 = (this->biases).data;
      pAVar3 = (this->biases).allocator;
      if (pAVar3 == (Allocator *)0x0) {
        if (pvVar2 != (void *)0x0) {
          free(*(void **)((long)pvVar2 + -8));
        }
      }
      else {
        (**(code **)(*(long *)pAVar3 + 8))();
      }
    }
  }
  (this->biases).data = (void *)0x0;
  (this->biases).refcount = (int *)0x0;
  (this->biases).elemsize = 0;
  (this->biases).cstep = 0;
  (this->biases).dims = 0;
  (this->biases).w = 0;
  (this->biases).h = 0;
  (this->biases).c = 0;
  Layer::~Layer(&this->super_Layer);
  return;
}

Assistant:

YoloDetectionOutput::~YoloDetectionOutput()
{
    delete softmax;
}